

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDEdgeSharpness::SetEdgeChainSharpness
          (ON_SubDEdgeSharpness *this,ON_Interval chain_sharpness_range,uint edge_count,
          ON_SimpleArray<ON_SubDEdgeSharpness> *chain_edge_sharpness)

{
  int iVar1;
  uint uVar2;
  ON_SubDEdgeSharpness *chain_edge_sharpness_00;
  undefined4 in_register_00000034;
  ON_SimpleArray<ON_SubDEdgeSharpness> *this_00;
  
  this_00 = (ON_SimpleArray<ON_SubDEdgeSharpness> *)CONCAT44(in_register_00000034,edge_count);
  iVar1 = (int)this;
  if (1 < iVar1 + 1U) {
    ON_SimpleArray<ON_SubDEdgeSharpness>::Reserve(this_00,(size_t)((ulong)this & 0xffffffff));
    if ((-1 < iVar1) && (iVar1 <= this_00->m_capacity)) {
      this_00->m_count = iVar1;
    }
    uVar2 = SetEdgeChainSharpness
                      ((ON_SubDEdgeSharpness *)((ulong)this & 0xffffffff),chain_sharpness_range,
                       (uint)this_00->m_a,chain_edge_sharpness_00);
    if (uVar2 != 0) {
      return uVar2;
    }
    if (-1 < this_00->m_capacity) {
      this_00->m_count = 0;
    }
  }
  return 0;
}

Assistant:

unsigned ON_SubDEdgeSharpness::SetEdgeChainSharpness(
  ON_Interval chain_sharpness_range,
  unsigned edge_count,
  ON_SimpleArray<ON_SubDEdgeSharpness>& chain_edge_sharpness
)
{
  if (edge_count <= 0 || edge_count >= ON_UNSET_UINT_INDEX)
    return 0;
  chain_edge_sharpness.Reserve(edge_count);
  chain_edge_sharpness.SetCount(edge_count);
  const unsigned rc = ON_SubDEdgeSharpness::SetEdgeChainSharpness(chain_sharpness_range, edge_count, chain_edge_sharpness.Array());
  if (rc <= 0)
    chain_edge_sharpness.SetCount(0);
  return rc;
}